

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# high_primitives.c
# Opt level: O3

void al_draw_rounded_rectangle
               (float x1,float y1,float x2,float y2,float rx,float ry,ALLEGRO_COLOR color,
               float thickness)

{
  undefined8 uVar1;
  ulong uVar2;
  uint uVar3;
  long lVar4;
  float *pfVar5;
  long lVar6;
  uint uVar7;
  int end;
  long lVar8;
  long lVar9;
  long lVar10;
  int type;
  ulong uVar11;
  uint uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  ALLEGRO_VERTEX vertex_cache [256];
  float local_2478;
  float fStack_2474;
  float fStack_2440;
  undefined8 uStack_243c;
  float local_2428;
  float fStack_241c;
  undefined8 local_2418;
  undefined8 uStack_2410;
  undefined8 local_2408;
  float fStack_2404;
  undefined8 uStack_2400;
  float local_23f8;
  undefined8 local_23f4;
  undefined8 uStack_23ec;
  undefined8 local_23e4;
  undefined8 uStack_23dc;
  float local_23d4;
  
  uStack_243c._4_4_ = x1;
  local_2428 = x2;
  fVar13 = get_scale();
  fVar14 = (rx + ry) * 0.5;
  if (fVar14 < 0.0) {
    fVar14 = sqrtf(fVar14);
  }
  else {
    fVar14 = SQRT(fVar14);
  }
  uVar12 = (uint)(fVar13 * 10.0 * fVar14 * 0.25);
  local_2478 = color.r;
  fStack_2474 = color.g;
  if (thickness <= 0.0) {
    if ((int)uVar12 < 2) goto LAB_001073ac;
    uVar7 = 0x3f;
    if (uVar12 < 0x3f) {
      uVar7 = uVar12;
    }
    fVar13 = cosf(1.5707964 / (float)(int)uVar7);
    fVar14 = sinf(1.5707964 / (float)(int)uVar7);
    uVar3 = 0x3f;
    if (uVar12 < 0x3f) {
      uVar3 = uVar12;
    }
    fVar16 = 1.0;
    fVar17 = 0.0;
    lVar6 = 0;
    do {
      *(ulong *)((long)&local_2418 + lVar6) = CONCAT44(ry * fVar17 + 0.0,rx * fVar16 + 0.0);
      fVar15 = fVar16 * fVar14;
      fVar16 = fVar16 * fVar13 + fVar17 * -fVar14;
      fVar17 = fVar15 + fVar17 * fVar13;
      lVar6 = lVar6 + 0x24;
    } while (uVar3 * 0x24 + 0x24 != (int)lVar6);
    uVar2 = (ulong)uVar7;
    lVar6 = uVar2 * 0x24;
    lVar4 = -0x24;
    lVar8 = 0;
    do {
      uVar1 = *(undefined8 *)((long)&local_2418 + lVar4 + lVar6);
      *(ulong *)((long)&local_2418 + lVar8 + lVar6) =
           CONCAT44((y1 + ry) - (float)((ulong)uVar1 >> 0x20),
                    (uStack_243c._4_4_ + rx) - (float)uVar1);
      *(float *)((long)&local_2418 + lVar8 + uVar2 * 0x48) =
           (uStack_243c._4_4_ + rx) - *(float *)((long)&local_2418 + lVar8);
      *(float *)((long)&local_2418 + lVar8 + uVar2 * 0x48 + 4) =
           *(float *)((long)&local_2418 + lVar8 + 4) + (y2 - ry);
      uVar1 = *(undefined8 *)((long)&local_2418 + lVar4 + lVar6);
      *(ulong *)((long)&local_2418 + lVar8 + uVar2 * 0x6c) =
           CONCAT44((float)((ulong)uVar1 >> 0x20) + (y2 - ry),(float)uVar1 + (local_2428 - rx));
      lVar8 = lVar8 + 0x24;
      lVar4 = lVar4 + -0x24;
    } while (lVar6 != lVar8);
    lVar4 = 0;
    do {
      *(float *)((long)&local_2418 + lVar4) =
           *(float *)((long)&local_2418 + lVar4) + (local_2428 - rx);
      *(float *)((long)&local_2418 + lVar4 + 4) =
           (y1 + ry) - *(float *)((long)&local_2418 + lVar4 + 4);
      lVar4 = lVar4 + 0x24;
    } while (lVar6 != lVar4);
    end = uVar7 << 2;
    lVar6 = 0;
    do {
      *(float *)((long)&fStack_2404 + lVar6) = local_2478;
      *(float *)((long)&uStack_2400 + lVar6) = fStack_2474;
      *(float *)((long)&uStack_2400 + lVar6 + 4) = color.b;
      *(float *)((long)&local_23f8 + lVar6) = color.a;
      *(undefined4 *)((long)&uStack_2410 + lVar6) = 0;
      lVar6 = lVar6 + 0x24;
    } while (uVar2 * 0x90 != lVar6);
    type = 2;
  }
  else {
    if ((int)uVar12 < 2) {
LAB_001073ac:
      al_draw_rectangle(uStack_243c._4_4_,y1,local_2428,y2,color,thickness);
      return;
    }
    uVar7 = 0x1f;
    if ((int)(uVar12 * 8 + 2) < 0x100) {
      uVar7 = uVar12;
    }
    al_calculate_arc((float *)&local_2418,0x24,0.0,0.0,rx,ry,0.0,1.5707964,thickness,uVar7);
    uVar2 = (ulong)(uVar7 * 2);
    fVar16 = uStack_243c._4_4_ + rx;
    fVar17 = y1 + ry;
    fVar13 = local_2428 - rx;
    fVar14 = y2 - ry;
    lVar4 = (ulong)(uVar7 * 6) * 0x24;
    lVar6 = (ulong)(uVar7 * 4) * 0x24 + 0x28;
    lVar8 = uVar2 * 0x24;
    lVar9 = uVar2 * 0x24 + -0x24;
    lVar10 = 0x28;
    uVar11 = 0;
    do {
      *(ulong *)((long)&local_23f4 + lVar8) =
           CONCAT44(fVar17 - (float)((ulong)*(undefined8 *)((long)&local_2418 + lVar9) >> 0x20),
                    fVar16 - (float)*(undefined8 *)((long)&local_2418 + lVar9));
      *(ulong *)((long)&local_2418 + lVar8) =
           CONCAT44(fVar17 - (float)((ulong)*(undefined8 *)((long)&uStack_243c + lVar9) >> 0x20),
                    fVar16 - (float)*(undefined8 *)((long)&uStack_243c + lVar9));
      *(float *)((long)&fStack_2440 + lVar6) = fVar16 - *(float *)((long)&fStack_2440 + lVar10);
      *(float *)((long)&uStack_243c + lVar6) = *(float *)((long)&uStack_243c + lVar10) + fVar14;
      *(float *)((long)&fStack_241c + lVar6) = fVar16 - *(float *)((long)&fStack_241c + lVar10);
      *(float *)((long)&local_2418 + lVar6) = *(float *)((long)&local_2418 + lVar10) + fVar14;
      *(ulong *)((long)&local_23f4 + lVar4) =
           CONCAT44((float)((ulong)*(undefined8 *)((long)&local_2418 + lVar9) >> 0x20) + fVar14,
                    (float)*(undefined8 *)((long)&local_2418 + lVar9) + fVar13);
      *(ulong *)((long)&local_2418 + lVar4) =
           CONCAT44((float)((ulong)*(undefined8 *)((long)&uStack_243c + lVar9) >> 0x20) + fVar14,
                    (float)*(undefined8 *)((long)&uStack_243c + lVar9) + fVar13);
      uVar11 = uVar11 + 2;
      lVar4 = lVar4 + 0x48;
      lVar6 = lVar6 + 0x48;
      lVar8 = lVar8 + 0x48;
      lVar9 = lVar9 + -0x48;
      lVar10 = lVar10 + 0x48;
    } while (uVar11 < uVar2);
    pfVar5 = (float *)((long)&local_23f4 + 4);
    uVar11 = 0;
    do {
      pfVar5[-10] = pfVar5[-10] + fVar13;
      pfVar5[-9] = fVar17 - pfVar5[-9];
      pfVar5[-1] = pfVar5[-1] + fVar13;
      *pfVar5 = fVar17 - *pfVar5;
      uVar11 = uVar11 + 2;
      pfVar5 = pfVar5 + 0x12;
    } while (uVar11 < uVar2);
    uVar2 = (ulong)(uVar7 * 8);
    lVar6 = uVar2 * 0x24;
    (&local_23f8)[uVar2 * 9] = local_23f8;
    *(undefined8 *)((long)&stack0xffffffffffffdbf8 + lVar6) = local_2408;
    *(undefined8 *)((long)&uStack_2400 + lVar6) = uStack_2400;
    *(undefined8 *)((long)&local_2418 + lVar6) = local_2418;
    *(undefined8 *)((long)&uStack_2410 + lVar6) = uStack_2410;
    uVar11 = (ulong)(uVar7 * 8 + 1);
    (&local_23f8)[uVar11 * 9] = local_23d4;
    *(undefined8 *)((long)&stack0xffffffffffffdbf8 + uVar11 * 0x24) = local_23e4;
    *(undefined8 *)((long)&uStack_2400 + uVar11 * 0x24) = uStack_23dc;
    *(undefined8 *)((long)&local_2418 + uVar11 * 0x24) = local_23f4;
    *(undefined8 *)((long)&uStack_2410 + uVar11 * 0x24) = uStack_23ec;
    end = uVar7 * 8 + 2;
    lVar6 = 0;
    do {
      *(float *)((long)&fStack_2404 + lVar6) = local_2478;
      *(float *)((long)&uStack_2400 + lVar6) = fStack_2474;
      *(float *)((long)&uStack_2400 + lVar6 + 4) = color.b;
      *(float *)((long)&local_23f8 + lVar6) = color.a;
      *(undefined4 *)((long)&uStack_2410 + lVar6) = 0;
      lVar6 = lVar6 + 0x24;
    } while (uVar2 * 0x24 + 0x48 != lVar6);
    type = 4;
  }
  al_draw_prim(&local_2418,(ALLEGRO_VERTEX_DECL *)0x0,(ALLEGRO_BITMAP *)0x0,0,end,type);
  return;
}

Assistant:

void al_draw_rounded_rectangle(float x1, float y1, float x2, float y2,
   float rx, float ry, ALLEGRO_COLOR color, float thickness)
{
   LOCAL_VERTEX_CACHE;
   float scale = get_scale();

   ASSERT(rx >= 0);
   ASSERT(ry >= 0);

   if (thickness > 0) {
      int num_segments = ALLEGRO_PRIM_QUALITY * scale * sqrtf((rx + ry) / 2.0f) / 4;
      int ii;

      /* In case rx and ry are both 0. */
      if (num_segments < 2) {
         al_draw_rectangle(x1, y1, x2, y2, color, thickness);
         return;
      }

      if (8 * num_segments + 2 >= ALLEGRO_VERTEX_CACHE_SIZE) {
         num_segments = (ALLEGRO_VERTEX_CACHE_SIZE - 3) / 8;
      }
      
      al_calculate_arc(&(vertex_cache[0].x), sizeof(ALLEGRO_VERTEX), 0, 0, rx, ry, 0, ALLEGRO_PI / 2, thickness, num_segments);
      
      for (ii = 0; ii < 2 * num_segments; ii += 2) {
         vertex_cache[ii + 2 * num_segments + 1].x = x1 + rx - vertex_cache[2 * num_segments - 1 - ii].x;
         vertex_cache[ii + 2 * num_segments + 1].y = y1 + ry - vertex_cache[2 * num_segments - 1 - ii].y;
         vertex_cache[ii + 2 * num_segments].x = x1 + rx - vertex_cache[2 * num_segments - 1 - ii - 1].x;
         vertex_cache[ii + 2 * num_segments].y = y1 + ry - vertex_cache[2 * num_segments - 1 - ii - 1].y;

         vertex_cache[ii + 4 * num_segments].x = x1 + rx - vertex_cache[ii].x;
         vertex_cache[ii + 4 * num_segments].y = y2 - ry + vertex_cache[ii].y;
         vertex_cache[ii + 4 * num_segments + 1].x = x1 + rx - vertex_cache[ii + 1].x;
         vertex_cache[ii + 4 * num_segments + 1].y = y2 - ry + vertex_cache[ii + 1].y;

         vertex_cache[ii + 6 * num_segments + 1].x = x2 - rx + vertex_cache[2 * num_segments - 1 - ii].x;
         vertex_cache[ii + 6 * num_segments + 1].y = y2 - ry + vertex_cache[2 * num_segments - 1 - ii].y;
         vertex_cache[ii + 6 * num_segments].x = x2 - rx + vertex_cache[2 * num_segments - 1 - ii - 1].x;
         vertex_cache[ii + 6 * num_segments].y = y2 - ry + vertex_cache[2 * num_segments - 1 - ii - 1].y;
      }
      for (ii = 0; ii < 2 * num_segments; ii += 2) {
         vertex_cache[ii].x = x2 - rx + vertex_cache[ii].x;
         vertex_cache[ii].y = y1 + ry - vertex_cache[ii].y;
         vertex_cache[ii + 1].x = x2 - rx + vertex_cache[ii + 1].x;
         vertex_cache[ii + 1].y = y1 + ry - vertex_cache[ii + 1].y;
      }
      vertex_cache[8 * num_segments] = vertex_cache[0];
      vertex_cache[8 * num_segments + 1] = vertex_cache[1];

      for (ii = 0; ii < 8 * num_segments + 2; ii++) {
         vertex_cache[ii].color = color;
         vertex_cache[ii].z = 0;
      }
         
      al_draw_prim(vertex_cache, 0, 0, 0, 8 * num_segments + 2, ALLEGRO_PRIM_TRIANGLE_STRIP);
   } else {
      int num_segments = ALLEGRO_PRIM_QUALITY * scale * sqrtf((rx + ry) / 2.0f) / 4;
      int ii;
      
      /* In case rx and ry are both 0. */
      if (num_segments < 2) {
         al_draw_rectangle(x1, y1, x2, y2, color, thickness);
         return;
      }

      if (num_segments * 4 >= ALLEGRO_VERTEX_CACHE_SIZE) {
         num_segments = (ALLEGRO_VERTEX_CACHE_SIZE - 1) / 4;
      }
      
      al_calculate_arc(&(vertex_cache[0].x), sizeof(ALLEGRO_VERTEX), 0, 0, rx, ry, 0, ALLEGRO_PI / 2, 0, num_segments + 1);

      for (ii = 0; ii < num_segments; ii++) {
         vertex_cache[ii + 1 * num_segments].x = x1 + rx - vertex_cache[num_segments - 1 - ii].x;
         vertex_cache[ii + 1 * num_segments].y = y1 + ry - vertex_cache[num_segments - 1 - ii].y;

         vertex_cache[ii + 2 * num_segments].x = x1 + rx - vertex_cache[ii].x;
         vertex_cache[ii + 2 * num_segments].y = y2 - ry + vertex_cache[ii].y;

         vertex_cache[ii + 3 * num_segments].x = x2 - rx + vertex_cache[num_segments - 1 - ii].x;
         vertex_cache[ii + 3 * num_segments].y = y2 - ry + vertex_cache[num_segments - 1 - ii].y;
      }
      for (ii = 0; ii < num_segments; ii++) {
         vertex_cache[ii].x = x2 - rx + vertex_cache[ii].x;
         vertex_cache[ii].y = y1 + ry - vertex_cache[ii].y;
      }

      for (ii = 0; ii < 4 * num_segments; ii++) {
         vertex_cache[ii].color = color;
         vertex_cache[ii].z = 0;
      }
         
      al_draw_prim(vertex_cache, 0, 0, 0, 4 * num_segments, ALLEGRO_PRIM_LINE_LOOP);
   }
}